

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O3

void front::word::word_analyse
               (string *input_str,
               vector<front::word::Word,_std::allocator<front::word::Word>_> *word_arr)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Token in_token_value;
  ulong uVar5;
  byte *pbVar6;
  byte bVar8;
  ulong uVar9;
  undefined8 uVar10;
  char cVar11;
  _Alloc_hider _Var12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  string *psVar16;
  string buf;
  undefined1 local_3d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  vector<front::word::Word,_std::allocator<front::word::Word>_> *local_3a0;
  string *local_398;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  pointer pcVar7;
  
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390._M_string_length = 0;
  local_390.field_2._M_local_buf[0] = '\0';
  local_3a0 = word_arr;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0,'\0'
                 ,input_str);
  local_398 = input_str;
  std::__cxx11::string::operator=((string *)input_str,(string *)local_3d0);
  if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  uVar5 = local_398->_M_string_length;
  uVar9 = 0;
  bVar8 = 0;
  psVar16 = local_398;
  do {
    if (uVar5 <= uVar9) break;
    uVar14 = uVar9 + 1;
    if ((uVar14 < uVar5) &&
       (bVar8 = (psVar16->_M_dataplus)._M_p[uVar14], uVar9 = uVar14, bVar8 == 10)) {
      line_num = line_num + 1;
      bVar8 = 10;
    }
    local_390._M_string_length = 0;
    *local_390._M_dataplus._M_p = '\0';
    pcVar7 = (psVar16->_M_dataplus)._M_p;
    uVar5 = psVar16->_M_string_length;
    uVar14 = uVar9 + 1;
    if (uVar9 + 1 < uVar5) {
      uVar14 = uVar5;
    }
    uVar15 = line_num;
    while (((0x5d < (byte)(bVar8 - 0x21) ||
            (((bVar8 - 0x40 < 0x3f &&
              ((0x4000000140000001U >> ((ulong)(bVar8 - 0x40) & 0x3f) & 1) != 0)) ||
             (uVar13 = uVar9, bVar8 - 0x23 < 2)))) &&
           (uVar1 = uVar9 + 1, uVar13 = uVar14 - 1, uVar1 < uVar5))) {
      bVar8 = pcVar7[uVar9 + 1];
      uVar9 = uVar1;
      if (bVar8 == 10) {
        uVar15 = uVar15 + 1;
        line_num = uVar15;
      }
    }
    iVar4 = isalpha((int)(char)bVar8);
    psVar16 = local_398;
    if ((bVar8 == 0x5f) || (iVar4 != 0)) {
      do {
        std::__cxx11::string::push_back((char)&local_390);
        uVar9 = uVar13 + 1;
        if ((uVar9 < psVar16->_M_string_length) &&
           (bVar8 = (psVar16->_M_dataplus)._M_p[uVar9], uVar13 = uVar9, bVar8 == 10)) {
          line_num = line_num + 1;
          bVar8 = 10;
        }
        iVar4 = isalpha((int)(char)bVar8);
      } while ((int)(char)bVar8 - 0x30U < 10 || (bVar8 == 0x5f || iVar4 != 0));
      if (bVar8 == 10) {
        line_num = line_num - 1;
      }
      bVar8 = (psVar16->_M_dataplus)._M_p[uVar13 - 1];
      in_token_value = get_token(&local_390);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,in_token_value,&local_50,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      uVar10 = local_50.field_2._M_allocated_capacity;
      _Var12._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_001ad34a;
      goto LAB_001ad352;
    }
    if ((int)(char)bVar8 - 0x30U < 10) {
      if (bVar8 == 0x30) {
        toupper(0x30);
        cVar11 = (char)&local_390;
        std::__cxx11::string::push_back(cVar11);
        psVar16 = local_398;
        uVar9 = uVar13 + 1;
        bVar8 = 0x30;
        uVar5 = uVar13;
        if (uVar9 < local_398->_M_string_length) {
          pcVar7 = (local_398->_M_dataplus)._M_p;
          bVar8 = pcVar7[uVar9];
          if (bVar8 != 10) {
            if ((bVar8 & 0xdf) == 0x58) {
              toupper((uint)bVar8);
              std::__cxx11::string::push_back(cVar11);
              uVar13 = uVar13 + 2;
              if ((uVar13 < psVar16->_M_string_length) &&
                 (bVar8 = (psVar16->_M_dataplus)._M_p[uVar13], uVar9 = uVar13, bVar8 == 10)) {
                line_num = line_num + 1;
                bVar8 = 10;
              }
              do {
                toupper((int)(char)bVar8);
                std::__cxx11::string::push_back(cVar11);
                uVar5 = uVar9 + 1;
                if ((uVar5 < psVar16->_M_string_length) &&
                   (bVar8 = (psVar16->_M_dataplus)._M_p[uVar5], uVar9 = uVar5, bVar8 == 10)) {
                  line_num = line_num + 1;
                  bVar8 = 10;
                }
                uVar15 = tolower((int)(char)bVar8);
              } while (uVar15 << 0x18 == 0x66000000 ||
                       (((uVar15 & 0xfe) == 100 || (int)(char)bVar8 - 0x30U < 10) ||
                       ((uVar15 & 0xfd) == 0x61 || uVar15 << 0x18 == 0x62000000)));
              if (bVar8 == 10) {
                line_num = line_num - 1;
              }
              uVar13 = uVar9 - 1;
              pbVar6 = (byte *)((psVar16->_M_dataplus)._M_p + uVar13);
              goto LAB_001ad81d;
            }
            uVar5 = uVar9;
            if ((bVar8 & 0xf8) == 0x30) goto LAB_001ad5ad;
            pcVar7 = (local_398->_M_dataplus)._M_p;
          }
          pbVar6 = (byte *)(pcVar7 + uVar13);
        }
        else {
LAB_001ad5ad:
          do {
            std::__cxx11::string::push_back(cVar11);
            uVar13 = uVar5 + 1;
            if ((uVar13 < psVar16->_M_string_length) &&
               (bVar8 = (psVar16->_M_dataplus)._M_p[uVar13], uVar5 = uVar13, bVar8 == 10))
            goto LAB_001ad811;
          } while ((int)(char)bVar8 - 0x30U < 10);
          uVar13 = uVar5;
          if (bVar8 == 10) {
            line_num = line_num - 1;
          }
LAB_001ad811:
          uVar13 = uVar13 - 1;
          pbVar6 = (byte *)((psVar16->_M_dataplus)._M_p + uVar13);
        }
      }
      else {
        do {
          std::__cxx11::string::push_back((char)&local_390);
          uVar9 = uVar13 + 1;
          if ((uVar9 < psVar16->_M_string_length) &&
             (bVar8 = (psVar16->_M_dataplus)._M_p[uVar9], uVar13 = uVar9, bVar8 == 10))
          goto LAB_001ad612;
        } while ((int)(char)bVar8 - 0x30U < 10);
        uVar9 = uVar13;
        if (bVar8 == 10) {
          line_num = line_num - 1;
        }
LAB_001ad612:
        uVar13 = uVar9 - 1;
        pbVar6 = (byte *)((psVar16->_M_dataplus)._M_p + uVar13);
      }
LAB_001ad81d:
      bVar8 = *pbVar6;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,INTCON,&local_70,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      uVar10 = local_70.field_2._M_allocated_capacity;
      _Var12._M_p = local_70._M_dataplus._M_p;
      uVar9 = uVar13;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_001ad8a8:
        operator_delete(_Var12._M_p,uVar10 + 1);
        uVar9 = uVar13;
      }
      goto LAB_001ad8b0;
    }
    uVar9 = uVar13;
    if (0x5a < bVar8) {
      cVar11 = (char)&local_390;
      if (bVar8 < 0x7b) {
        if (bVar8 == 0x5b) {
          std::__cxx11::string::push_back(cVar11);
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_310,local_390._M_dataplus._M_p,
                     local_390._M_dataplus._M_p + local_390._M_string_length);
          Word::Word((Word *)local_3d0,LBRACK,&local_310,line_num);
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
          emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._8_8_ != &local_3b8) {
            operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          bVar8 = 0x5b;
        }
        else if (bVar8 == 0x5d) {
          std::__cxx11::string::push_back(cVar11);
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_330,local_390._M_dataplus._M_p,
                     local_390._M_dataplus._M_p + local_390._M_string_length);
          Word::Word((Word *)local_3d0,RBRACK,&local_330,line_num);
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
          emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3d0._8_8_ != &local_3b8) {
            operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          bVar8 = 0x5d;
        }
      }
      else if (bVar8 == 0x7b) {
        std::__cxx11::string::push_back(cVar11);
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_350,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3d0,LBRACE,&local_350,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._8_8_ != &local_3b8) {
          operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
        bVar8 = 0x7b;
      }
      else if (bVar8 == 0x7c) {
        std::__cxx11::string::push_back(cVar11);
        uVar9 = uVar13 + 1;
        bVar8 = 0x7c;
        if ((uVar9 < psVar16->_M_string_length) &&
           (bVar8 = (psVar16->_M_dataplus)._M_p[uVar9], uVar13 = uVar9, bVar8 == 10)) {
          line_num = line_num + 1;
          bVar8 = 10;
        }
        std::__cxx11::string::push_back(cVar11);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_270,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3d0,OR,&local_270,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._8_8_ != &local_3b8) {
          operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
        }
        uVar10 = local_270.field_2._M_allocated_capacity;
        _Var12._M_p = local_270._M_dataplus._M_p;
        uVar9 = uVar13;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) goto LAB_001ad8a8;
      }
      else if (bVar8 == 0x7d) {
        std::__cxx11::string::push_back(cVar11);
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3d0,RBRACE,&local_370,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._8_8_ != &local_3b8) {
          operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        bVar8 = 0x7d;
      }
      goto LAB_001ad8b0;
    }
    switch(bVar8) {
    case 0x21:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      uVar9 = uVar13 + 1;
      pcVar7 = (local_398->_M_dataplus)._M_p;
      if ((uVar9 < local_398->_M_string_length) && (uVar13 = uVar9, pcVar7[uVar9] == '=')) {
        std::__cxx11::string::push_back((char)&local_390);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3d0,NEQ,&local_210,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._8_8_ != &local_3b8) {
          operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
        }
        uVar10 = local_210.field_2._M_allocated_capacity;
        _Var12._M_p = local_210._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
LAB_001ae696:
          operator_delete(_Var12._M_p,uVar10 + 1);
        }
        goto LAB_001ae69e;
      }
      bVar8 = pcVar7[uVar13 - 1];
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,NOT,&local_230,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      uVar10 = local_230.field_2._M_allocated_capacity;
      _Var12._M_p = local_230._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
LAB_001ad34a:
        operator_delete(_Var12._M_p,uVar10 + 1);
      }
LAB_001ad352:
      uVar9 = uVar13 - 1;
      break;
    case 0x22:
      uVar13 = uVar13 + 1;
      if ((uVar13 < uVar5) && (cVar11 = pcVar7[uVar13], uVar9 = uVar13, cVar11 != '\"')) {
        if (cVar11 == '\n') {
          line_num = uVar15 + 1;
          cVar11 = '\n';
        }
        do {
          std::__cxx11::string::push_back((char)&local_390);
          uVar9 = uVar13 + 1;
          if ((uVar9 < local_398->_M_string_length) &&
             (cVar11 = (local_398->_M_dataplus)._M_p[uVar9], uVar13 = uVar9, cVar11 == '\n')) {
            line_num = line_num + 1;
            cVar11 = '\n';
          }
          uVar9 = uVar13;
        } while (cVar11 != '\"');
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,STRCON,&local_90,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      psVar16 = local_398;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      bVar8 = 0x22;
      break;
    default:
      break;
    case 0x25:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,MOD,&local_130,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      bVar8 = 0x25;
      break;
    case 0x26:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      uVar9 = uVar13 + 1;
      bVar8 = 0x26;
      if ((uVar9 < local_398->_M_string_length) &&
         (bVar8 = (local_398->_M_dataplus)._M_p[uVar9], uVar13 = uVar9, bVar8 == 10)) {
        line_num = line_num + 1;
        bVar8 = 10;
      }
      std::__cxx11::string::push_back((char)&local_390);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,AND,&local_250,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      uVar10 = local_250.field_2._M_allocated_capacity;
      _Var12._M_p = local_250._M_dataplus._M_p;
      uVar9 = uVar13;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) goto LAB_001ad8a8;
      break;
    case 0x28:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,LPARENT,&local_2d0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      bVar8 = 0x28;
      break;
    case 0x29:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,RPARENT,&local_2f0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      bVar8 = 0x29;
      break;
    case 0x2a:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,MULT,&local_f0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      bVar8 = 0x2a;
      break;
    case 0x2b:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,PLUS,&local_b0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      bVar8 = 0x2b;
      break;
    case 0x2c:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,COMMA,&local_2b0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      bVar8 = 0x2c;
      break;
    case 0x2d:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,MINU,&local_d0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      bVar8 = 0x2d;
      break;
    case 0x2f:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      uVar9 = uVar13 + 1;
      uVar5 = local_398->_M_string_length;
      uVar14 = uVar13;
      if (uVar9 < uVar5) {
        pcVar7 = (local_398->_M_dataplus)._M_p;
        cVar11 = pcVar7[uVar9];
        if (cVar11 != '\n') {
          if (cVar11 == '*') {
            cVar11 = '*';
            uVar15 = line_num;
            bVar3 = false;
            do {
              uVar14 = uVar9 + 1;
              if ((uVar14 < uVar5) &&
                 (cVar11 = (local_398->_M_dataplus)._M_p[uVar14], uVar9 = uVar14, cVar11 == '\n')) {
                uVar15 = uVar15 + 1;
                cVar11 = '\n';
                line_num = uVar15;
              }
              bVar2 = (bool)(bVar3 | cVar11 == '*');
              bVar3 = false;
            } while ((!bVar2) || (bVar8 = 0x2f, bVar3 = cVar11 == '*', cVar11 != '/'));
            break;
          }
          uVar14 = uVar9;
          if (cVar11 == '/') goto LAB_001ae5d1;
          pcVar7 = (local_398->_M_dataplus)._M_p;
        }
        bVar8 = pcVar7[uVar13];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3d0,DIV,&local_110,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._8_8_ != &local_3b8) {
          operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
        }
        uVar10 = local_110.field_2._M_allocated_capacity;
        _Var12._M_p = local_110._M_dataplus._M_p;
        uVar9 = uVar13;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_001ad8a8;
      }
      else {
LAB_001ae5d1:
        do {
          uVar14 = uVar14 + 1;
          do {
          } while (uVar5 <= uVar14);
        } while ((local_398->_M_dataplus)._M_p[uVar14] != '\n');
        line_num = line_num + 1;
        bVar8 = 10;
        uVar9 = uVar14;
      }
      break;
    case 0x3b:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,SEMICN,&local_290,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      bVar8 = 0x3b;
      break;
    case 0x3c:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      uVar9 = uVar13 + 1;
      pcVar7 = (local_398->_M_dataplus)._M_p;
      if ((local_398->_M_string_length <= uVar9) || (uVar13 = uVar9, pcVar7[uVar9] != '=')) {
        bVar8 = pcVar7[uVar13 - 1];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3d0,LSS,&local_170,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._8_8_ != &local_3b8) {
          operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
        }
        uVar10 = local_170.field_2._M_allocated_capacity;
        _Var12._M_p = local_170._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) goto LAB_001ad34a;
        goto LAB_001ad352;
      }
      std::__cxx11::string::push_back((char)&local_390);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,LEQ,&local_150,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      uVar10 = local_150.field_2._M_allocated_capacity;
      _Var12._M_p = local_150._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) goto LAB_001ae696;
      goto LAB_001ae69e;
    case 0x3d:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      uVar5 = uVar13 + 1;
      if ((local_398->_M_string_length <= uVar5) ||
         (pcVar7 = (local_398->_M_dataplus)._M_p, uVar9 = uVar5, pcVar7[uVar5] == '=')) {
        std::__cxx11::string::push_back((char)&local_390);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3d0,EQL,&local_1d0,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._8_8_ != &local_3b8) {
          operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
        }
        uVar10 = local_1d0.field_2._M_allocated_capacity;
        _Var12._M_p = local_1d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_001ae696;
        goto LAB_001ae69e;
      }
      bVar8 = pcVar7[uVar13];
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,ASSIGN,&local_1f0,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      uVar10 = local_1f0.field_2._M_allocated_capacity;
      _Var12._M_p = local_1f0._M_dataplus._M_p;
      uVar9 = uVar13;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_001ad8a8;
      break;
    case 0x3e:
      std::__cxx11::string::push_back((char)&local_390);
      psVar16 = local_398;
      uVar9 = uVar13 + 1;
      pcVar7 = (local_398->_M_dataplus)._M_p;
      if ((local_398->_M_string_length <= uVar9) || (uVar13 = uVar9, pcVar7[uVar9] != '=')) {
        bVar8 = pcVar7[uVar13 - 1];
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,local_390._M_dataplus._M_p,
                   local_390._M_dataplus._M_p + local_390._M_string_length);
        Word::Word((Word *)local_3d0,GRE,&local_1b0,line_num);
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
        emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._8_8_ != &local_3b8) {
          operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
        }
        uVar10 = local_1b0.field_2._M_allocated_capacity;
        _Var12._M_p = local_1b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) goto LAB_001ad34a;
        goto LAB_001ad352;
      }
      std::__cxx11::string::push_back((char)&local_390);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_390._M_dataplus._M_p,
                 local_390._M_dataplus._M_p + local_390._M_string_length);
      Word::Word((Word *)local_3d0,GEQ,&local_190,line_num);
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::
      emplace_back<front::word::Word>(local_3a0,(Word *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._8_8_ != &local_3b8) {
        operator_delete((void *)local_3d0._8_8_,local_3b8._0_8_ + 1);
      }
      uVar10 = local_190.field_2._M_allocated_capacity;
      _Var12._M_p = local_190._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) goto LAB_001ae696;
LAB_001ae69e:
      bVar8 = 0x3d;
    }
LAB_001ad8b0:
    uVar5 = psVar16->_M_string_length;
  } while (uVar9 != uVar5 - 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,
                    CONCAT71(local_390.field_2._M_allocated_capacity._1_7_,
                             local_390.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void front::word::word_analyse(string &input_str, vector<Word> &word_arr) {
  string buf;
  size_t index = 0;
  char ch = 0;
  input_str = '\0' + input_str;
  while (index < input_str.size()) {
    get_char(ch, index, input_str);
    buf.clear();
    while ((!have_body_char(ch) || is_illegel_char(ch)) &&
           index + 1 < input_str.size()) {
      get_char(ch, index, input_str);
    }

    if (is_nodigit(ch)) {
      do {
        buf += ch;
        get_char(ch, index, input_str);
      } while (is_nodigit(ch) || isdigit(ch));
      retract(ch, index, input_str);
      word_arr.push_back(Word(get_token(buf), buf, line_num));
    } else if (isdigit(ch)) {
      if (ch != '0') {
        do {
          buf += ch;
          get_char(ch, index, input_str);
        } while (isdigit(ch));
        retract(ch, index, input_str);
      } else {
        buf += toupper(ch);
        get_char(ch, index, input_str);
        if (ch == 'x' || ch == 'X') {
          buf += toupper(ch);
          get_char(ch, index, input_str);
          do {
            buf += toupper(ch);
            get_char(ch, index, input_str);
          } while (hex_digit(ch));
          retract(ch, index, input_str);
        } else if (octal_digit(ch)) {
          do {
            buf += ch;
            get_char(ch, index, input_str);
          } while (isdigit(ch));
          retract(ch, index, input_str);

        } else {
          retract(ch, index, input_str);
        }
      }
      word_arr.push_back(Word(Token::INTCON, buf, line_num));
    } else if (ch == '\"') {
      get_char(ch, index, input_str);
      while (ch != '\"') {
        buf += ch;
        get_char(ch, index, input_str);
      }
      word_arr.push_back(Word(Token::STRCON, buf, line_num));
    } else if (ch == '+') {
      buf += ch;
      word_arr.push_back(Word(Token::PLUS, buf, line_num));
    } else if (ch == '-') {
      buf += ch;
      word_arr.push_back(Word(Token::MINU, buf, line_num));
    } else if (ch == '*') {
      buf += ch;
      word_arr.push_back(Word(Token::MULT, buf, line_num));
    } else if (ch == '/') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '/') {
        do {
          get_char(ch, index, input_str);
        } while (ch != '\n');
      } else if (ch == '*') {
        int stt = 0;
        do {
          get_char(ch, index, input_str);
          if (stt == 0) {
            if (ch == '*') {
              stt = 1;
            }
          }
          if (stt == 1) {
            if (ch == '/') {
              stt = 2;
            } else if (ch == '*') {
              stt = 1;
            } else {
              stt = 0;
            }
          }
        } while (stt < 2);
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::DIV, buf, line_num));
      }
    } else if (ch == '%') {
      buf += ch;
      word_arr.push_back(Word(Token::MOD, buf, line_num));
    } else if (ch == '<') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::LEQ, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::LSS, buf, line_num));
      }
    } else if (ch == '>') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::GEQ, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::GRE, buf, line_num));
      }
    } else if (ch == '=') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::EQL, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::ASSIGN, buf, line_num));
      }
    } else if (ch == '!') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::NEQ, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::NOT, buf, line_num));
      }

    } else if (ch == '&') {
      buf += ch;
      get_char(ch, index, input_str);
      buf += ch;
      word_arr.push_back(Word(Token::AND, buf, line_num));
    } else if (ch == '|') {
      buf += ch;
      get_char(ch, index, input_str);
      buf += ch;
      word_arr.push_back(Word(Token::OR, buf, line_num));
    } else if (ch == ';') {
      buf += ch;
      word_arr.push_back(Word(Token::SEMICN, buf, line_num));
    } else if (ch == ',') {
      buf += ch;
      word_arr.push_back(Word(Token::COMMA, buf, line_num));
    } else if (ch == '(') {
      buf += ch;
      word_arr.push_back(Word(Token::LPARENT, buf, line_num));
    } else if (ch == ')') {
      buf += ch;
      word_arr.push_back(Word(Token::RPARENT, buf, line_num));
    } else if (ch == '[') {
      buf += ch;
      word_arr.push_back(Word(Token::LBRACK, buf, line_num));
    } else if (ch == ']') {
      buf += ch;
      word_arr.push_back(Word(Token::RBRACK, buf, line_num));
    } else if (ch == '{') {
      buf += ch;
      word_arr.push_back(Word(Token::LBRACE, buf, line_num));
    } else if (ch == '}') {
      buf += ch;
      word_arr.push_back(Word(Token::RBRACE, buf, line_num));
    }

    if (index == input_str.size() - 1) {
      break;
    }
  }
}